

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

void __thiscall dxil_spv::Converter::Impl::mark_used_values(Impl *this,Instruction *instruction)

{
  bool bVar1;
  ValueKind VVar2;
  uint uVar3;
  PHINode *this_00;
  PHINode *value;
  ReturnInst *this_01;
  Value *pVVar4;
  BranchInst *this_02;
  SwitchInst *this_03;
  uint uVar5;
  
  if (instruction == (Instruction *)0x0) {
LAB_0012661b:
    uVar3 = LLVMBC::Instruction::getNumOperands(instruction);
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        pVVar4 = LLVMBC::Instruction::getOperand(instruction,uVar5);
        mark_used_value(this,pVVar4);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    return;
  }
  this_00 = (PHINode *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
  VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
  if (VVar2 == PHI) {
    uVar3 = LLVMBC::PHINode::getNumIncomingValues(this_00);
    if (uVar3 == 0) {
      return;
    }
    uVar5 = 0;
    do {
      value = (PHINode *)LLVMBC::PHINode::getIncomingValue(this_00,uVar5);
      if (value != this_00) {
        mark_used_value(this,(Value *)value);
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    return;
  }
  this_01 = (ReturnInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
  VVar2 = LLVMBC::Value::get_value_kind((Value *)this_01);
  if (VVar2 == Return) {
    pVVar4 = LLVMBC::ReturnInst::getReturnValue(this_01);
    if (pVVar4 == (Value *)0x0) {
      return;
    }
    pVVar4 = LLVMBC::ReturnInst::getReturnValue(this_01);
  }
  else {
    this_02 = (BranchInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this_02);
    if (VVar2 == Branch) {
      bVar1 = LLVMBC::BranchInst::isConditional(this_02);
      if (!bVar1) {
        return;
      }
      pVVar4 = LLVMBC::BranchInst::getCondition(this_02);
    }
    else {
      this_03 = (SwitchInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_03);
      if (VVar2 != Switch) goto LAB_0012661b;
      pVVar4 = LLVMBC::SwitchInst::getCondition(this_03);
    }
  }
  mark_used_value(this,pVVar4);
  return;
}

Assistant:

void Converter::Impl::mark_used_values(const llvm::Instruction *instruction)
{
	if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(instruction))
	{
		for (unsigned i = 0, n = phi_inst->getNumIncomingValues(); i < n; i++)
		{
			auto *incoming = phi_inst->getIncomingValue(i);
			// Ignore self-referential PHI. Someone else need to refer to us.
			if (incoming != phi_inst)
				mark_used_value(incoming);
		}
	}
	else if (const auto *ret_inst = llvm::dyn_cast<llvm::ReturnInst>(instruction))
	{
		if (ret_inst->getReturnValue())
			mark_used_value(ret_inst->getReturnValue());
	}
	else if (const auto *cond_inst = llvm::dyn_cast<llvm::BranchInst>(instruction))
	{
		if (cond_inst->isConditional())
			mark_used_value(cond_inst->getCondition());
	}
	else if (const auto *switch_inst = llvm::dyn_cast<llvm::SwitchInst>(instruction))
	{
		mark_used_value(switch_inst->getCondition());
	}
	else
	{
		for (unsigned i = 0, n = instruction->getNumOperands(); i < n; i++)
			mark_used_value(instruction->getOperand(i));
	}
}